

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlSavePattern1(Fra_Man_t *p,int fInit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_28;
  int nTruePis;
  int k;
  int i;
  Aig_Obj_t *pObj;
  int fInit_local;
  Fra_Man_t *p_local;
  
  memset(p->pPatWords,0xff,(long)p->nPatWords << 2);
  if (fInit != 0) {
    iVar1 = Aig_ManCiNum(p->pManAig);
    iVar2 = Aig_ManRegNum(p->pManAig);
    local_28 = 0;
    iVar3 = Aig_ManCiNum(p->pManAig);
    iVar4 = Aig_ManRegNum(p->pManAig);
    for (nTruePis = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pManAig->vCis), nTruePis < iVar3;
        nTruePis = nTruePis + 1) {
      Vec_PtrEntry(p->pManAig->vCis,nTruePis);
      Abc_InfoXorBit(p->pPatWords,(iVar1 - iVar2) * p->nFramesAll + local_28);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void Fra_SmlSavePattern1( Fra_Man_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i, k, nTruePis;
    memset( p->pPatWords, 0xff, sizeof(unsigned) * p->nPatWords );
    if ( !fInit )
        return;
    // clear the state bits to correspond to all-0 initial state
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    k = 0;
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Abc_InfoXorBit( p->pPatWords, nTruePis * p->nFramesAll + k++ );
}